

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::MergeFrom
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (other == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_51,other_00);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_ + this->current_size_);
    memcpy(this->rep_->elements + this->current_size_,other->rep_->elements,
           (long)other->current_size_ << 3);
    this->current_size_ = this->current_size_ + other->current_size_;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    Reserve(current_size_ + other.current_size_);
    CopyArray(rep_->elements + current_size_,
              other.rep_->elements, other.current_size_);
    current_size_ += other.current_size_;
  }
}